

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXConverter::ConvertRootNode(FBXConverter *this)

{
  aiNode *paVar1;
  aiMatrix4x4t<float> local_a4;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string unique_name;
  FBXConverter *this_local;
  
  paVar1 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar1);
  this->out->mRootNode = paVar1;
  std::__cxx11::string::string((string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"RootNode",&local_61);
  GetUniqueName(this,&local_60,(string *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  aiString::Set(&this->out->mRootNode->mName,(string *)local_40);
  paVar1 = this->out->mRootNode;
  aiMatrix4x4t<float>::aiMatrix4x4t(&local_a4);
  ConvertNodes(this,0,paVar1,&local_a4);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FBXConverter::ConvertRootNode() {
            out->mRootNode = new aiNode();
            std::string unique_name;
            GetUniqueName("RootNode", unique_name);
            out->mRootNode->mName.Set(unique_name);

            // root has ID 0
            ConvertNodes(0L, *out->mRootNode);
        }